

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QList<QGraphicsItem_*>_>::data(QList<QList<QGraphicsItem_*>_> *this)

{
  QArrayDataPointer<QList<QGraphicsItem_*>_> *this_00;
  QList<QGraphicsItem_*> *pQVar1;
  QArrayDataPointer<QList<QGraphicsItem_*>_> *in_RDI;
  
  detach((QList<QList<QGraphicsItem_*>_> *)0xa1d94c);
  this_00 = (QArrayDataPointer<QList<QGraphicsItem_*>_> *)
            QArrayDataPointer<QList<QGraphicsItem_*>_>::operator->(in_RDI);
  pQVar1 = QArrayDataPointer<QList<QGraphicsItem_*>_>::data(this_00);
  return pQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }